

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthRobots.cpp
# Opt level: O2

int match1vs1(int matches,long limit,string *command1,string *command2)

{
  bool bVar1;
  long lVar2;
  pointer p_Var3;
  _Result<void> *p_Var4;
  pointer p_Var5;
  pointer p_Var6;
  long lVar7;
  int *piVar8;
  int i;
  missile (*pamVar9) [2];
  int iVar10;
  _State_baseV2 *__tmp;
  missile *pmVar11;
  int iVar12;
  _State_baseV2 *__tmp_1;
  robot *prVar13;
  future<void> *this;
  __allocator_type __a2_1;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:445:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:445:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_1138;
  long local_1120;
  __state_type local_1118;
  __allocator_type __a2;
  __allocator_type __a2_2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_10f0 [2];
  long *local_10e0;
  long *local_10d8;
  int local_10d0;
  int local_10cc;
  string *local_10c8;
  string *local_10c0;
  __basic_future<void> local_10b8;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> allServersThreads;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:445:15)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:445:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_1088;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:457:15)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:457:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_1078;
  int wins [4];
  int ties [4];
  Forth forth2;
  Forth forth1;
  
  lVar2 = 0;
  LOCK();
  stopAll.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  r_debug = 0;
  for (; lVar2 != 2; lVar2 = lVar2 + 1) {
    wins[lVar2] = 0;
    ties[lVar2] = 0;
  }
  if (matches < 1) {
    matches = 0;
  }
  local_10d0 = matches + 1;
  local_10cc = 1;
  local_10c8 = command2;
  local_10c0 = command1;
  do {
    if (local_10cc == local_10d0) {
      iVar10 = 1;
      if (wins[0] <= wins[1]) {
        iVar10 = -(uint)(wins[0] < wins[1]);
      }
      return iVar10;
    }
    cppforth::Forth::Forth(&forth1);
    InitForthRobot(&forth1,step);
    InsertForthToInt(&forth1,0);
    cppforth::Forth::Forth(&forth2);
    InitForthRobot(&forth2,step);
    InsertForthToInt(&forth2,1);
    allServersThreads.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    allServersThreads.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    allServersThreads.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_1118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pointer)operator_new(0x58);
    local_1088._M_alloc = &__a2;
    (p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
    (p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
    (p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_00156680;
    *(undefined8 *)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 8) = 0;
    *(undefined4 *)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x10) = 0;
    (p_Var3->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
    *(undefined4 *)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x18) = 0;
    *(undefined8 *)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x20) = 0;
    *(undefined4 *)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x28) = 0;
    (p_Var3->_M_impl)._M_storage._M_storage.__align =
         (anon_struct_8_0_00000001_for___align)&PTR___Async_state_impl_001566d0;
    local_1088._M_ptr = p_Var3;
    p_Var4 = (_Result<void> *)operator_new(0x10);
    *(undefined8 *)p_Var4 = 0;
    *(undefined8 *)&p_Var4->field_0x8 = 0;
    std::__future_base::_Result<void>::_Result(p_Var4);
    *(_Result<void> **)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x30) = p_Var4;
    *(Forth **)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x38) = &forth1;
    *(string **)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x40) = local_10c0;
    local_1138._M_alloc =
         (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:445:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:445:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
          *)0x0;
    local_10e0 = (long *)operator_new(0x20);
    *local_10e0 = (long)&PTR___State_00156728;
    local_10e0[1] = (long)&p_Var3->_M_impl;
    local_10e0[2] =
         (long)std::__future_base::
               _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:445:15)>_>,_void>
               ::_M_run;
    local_10e0[3] = 0;
    std::thread::_M_start_thread(&local_1138,&local_10e0,0);
    if (local_10e0 != (long *)0x0) {
      (**(code **)(*local_10e0 + 8))();
    }
    std::thread::operator=
              ((thread *)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x20),
               (thread *)&local_1138);
    std::thread::~thread((thread *)&local_1138);
    local_1088._M_ptr = (pointer)0x0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:445:15)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:445:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr(&local_1088);
    a_Stack_10f0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1138._M_alloc =
         (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:445:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:445:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
          *)local_1118.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_1138._M_ptr =
         (pointer)local_1118.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    local_1118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)&p_Var3->_M_impl;
    local_1118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1138._M_ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_10f0);
    if (local_1118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      p_Var3 = (pointer)operator_new(0x48);
      local_1138._M_alloc = &__a2_1;
      (p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_00156768;
      *(undefined8 *)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 8) = 0;
      *(undefined4 *)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x10) = 0;
      (p_Var3->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
      *(undefined4 *)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x18) = 0;
      (p_Var3->_M_impl)._M_storage._M_storage.__align =
           (anon_struct_8_0_00000001_for___align)&PTR___Deferred_state_001567b8;
      local_1138._M_ptr = (pointer)p_Var3;
      p_Var4 = (_Result<void> *)operator_new(0x10);
      *(undefined8 *)p_Var4 = 0;
      *(undefined8 *)&p_Var4->field_0x8 = 0;
      std::__future_base::_Result<void>::_Result(p_Var4);
      *(_Result<void> **)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x20) = p_Var4;
      *(Forth **)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x28) = &forth1;
      *(string **)((long)&(p_Var3->_M_impl)._M_storage._M_storage + 0x30) = local_10c0;
      local_1138._M_ptr = (pointer)0x0;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:445:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:445:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr(&local_1138);
      a_Stack_10f0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1138._M_alloc =
           (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:445:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:445:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
            *)local_1118.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
      local_1138._M_ptr =
           (pointer)local_1118.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      local_1118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)&p_Var3->_M_impl;
      local_1118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1138._M_ptr);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_10f0);
    }
    std::__basic_future<void>::__basic_future(&local_10b8,&local_1118);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1118.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::vector<std::future<void>,std::allocator<std::future<void>>>::
    emplace_back<std::future<void>>
              ((vector<std::future<void>,std::allocator<std::future<void>>> *)&allServersThreads,
               (future<void> *)&local_10b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_10b8._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    local_1118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_1118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var5 = (pointer)operator_new(0x58);
    local_1078._M_alloc = &__a2_2;
    (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
    (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
    (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_00156800;
    *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 8) = 0;
    *(undefined4 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x10) = 0;
    (p_Var5->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
    *(undefined4 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x18) = 0;
    *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x20) = 0;
    *(undefined4 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x28) = 0;
    (p_Var5->_M_impl)._M_storage._M_storage.__align =
         (anon_struct_8_0_00000001_for___align)&PTR___Async_state_impl_00156850;
    local_1078._M_ptr = p_Var5;
    p_Var4 = (_Result<void> *)operator_new(0x10);
    *(undefined8 *)p_Var4 = 0;
    *(undefined8 *)&p_Var4->field_0x8 = 0;
    std::__future_base::_Result<void>::_Result(p_Var4);
    *(_Result<void> **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x30) = p_Var4;
    *(Forth **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x38) = &forth2;
    *(string **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x40) = local_10c8;
    local_1138._M_alloc =
         (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:445:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:445:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
          *)0x0;
    local_10d8 = (long *)operator_new(0x20);
    *local_10d8 = (long)&PTR___State_001568a8;
    local_10d8[1] = (long)&p_Var5->_M_impl;
    local_10d8[2] =
         (long)std::__future_base::
               _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:457:15)>_>,_void>
               ::_M_run;
    local_10d8[3] = 0;
    std::thread::_M_start_thread(&local_1138,&local_10d8,0);
    if (local_10d8 != (long *)0x0) {
      (**(code **)(*local_10d8 + 8))();
    }
    std::thread::operator=
              ((thread *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x20),
               (thread *)&local_1138);
    std::thread::~thread((thread *)&local_1138);
    local_1078._M_ptr = (pointer)0x0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:457:15)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:457:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr(&local_1078);
    a_Stack_10f0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1138._M_alloc =
         (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:445:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:445:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
          *)local_1118.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_1138._M_ptr =
         (pointer)local_1118.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    local_1118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)&p_Var5->_M_impl;
    local_1118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var5;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1138._M_ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_10f0);
    if (local_1118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      p_Var6 = (pointer)operator_new(0x48);
      local_1138._M_alloc = &__a2_1;
      (p_Var6->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var6->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var6->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_001568e8;
      *(undefined8 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 8) = 0;
      *(undefined4 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x10) = 0;
      (p_Var6->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
      *(undefined4 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x18) = 0;
      (p_Var6->_M_impl)._M_storage._M_storage.__align =
           (anon_struct_8_0_00000001_for___align)&PTR___Deferred_state_00156938;
      local_1138._M_ptr = p_Var6;
      p_Var4 = (_Result<void> *)operator_new(0x10);
      *(undefined8 *)p_Var4 = 0;
      *(undefined8 *)&p_Var4->field_0x8 = 0;
      std::__future_base::_Result<void>::_Result(p_Var4);
      *(_Result<void> **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x20) = p_Var4;
      *(Forth **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x28) = &forth2;
      *(string **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x30) = local_10c8;
      local_1138._M_ptr = (pointer)0x0;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:457:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:457:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:457:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:457:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                          *)&local_1138);
      a_Stack_10f0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1138._M_alloc =
           (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:445:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:445:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
            *)local_1118.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
      local_1138._M_ptr =
           (pointer)local_1118.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      local_1118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)&p_Var6->_M_impl;
      local_1118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var6;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1138._M_ptr);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_10f0);
    }
    std::__basic_future<void>::__basic_future(&local_10b8,&local_1118);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1118.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::vector<std::future<void>,std::allocator<std::future<void>>>::
    emplace_back<std::future<void>>
              ((vector<std::future<void>,std::allocator<std::future<void>>> *)&allServersThreads,
               (future<void> *)&local_10b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_10b8._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    prVar13 = robots;
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      init_robot((int)lVar2);
      prVar13->status = 1;
      prVar13 = prVar13 + 1;
    }
    iVar10 = 2;
    rand_pos(2);
    lVar2 = 0;
LAB_0010ed9f:
    iVar12 = 0xf;
    while ((1 < iVar10 && (lVar2 < limit))) {
      iVar10 = 0;
      for (lVar7 = 0; lVar7 != 0x170; lVar7 = lVar7 + 0xb8) {
        if (*(int *)(robots[0].name + lVar7 + -4) == 1) {
          cur_robot = (robot *)(robots[0].name + lVar7 + -4);
          iVar10 = iVar10 + 1;
        }
      }
      cycle(2);
      iVar12 = iVar12 + -1;
      if (iVar12 == 0) goto LAB_0010edf2;
    }
    lVar2 = 0;
    bVar1 = false;
    while( true ) {
      for (; lVar2 != 2; lVar2 = lVar2 + 1) {
        for (lVar7 = 0; lVar7 != 0x58; lVar7 = lVar7 + 0x2c) {
          if (*(int *)((long)&missiles[lVar2][0].stat + lVar7) == 1) {
            bVar1 = true;
          }
        }
      }
      if (!bVar1) break;
      move_robots(0);
      lVar2 = 0;
      move_miss(0);
      bVar1 = false;
    }
    iVar10 = 0;
    for (lVar2 = 0; lVar2 != 0x170; lVar2 = lVar2 + 0xb8) {
      iVar10 = iVar10 + (uint)(*(int *)(robots[0].name + lVar2 + -4) == 1);
    }
    piVar8 = ties;
    if (iVar10 == 1) {
      piVar8 = wins;
    }
    prVar13 = robots;
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      if (prVar13->status == 1) {
        piVar8[lVar2] = piVar8[lVar2] + 1;
      }
      prVar13 = prVar13 + 1;
    }
    LOCK();
    UNLOCK();
    stopAll.super___atomic_base<int>._M_i = (__atomic_base<int>)(__atomic_base<int>)1;
    for (iVar10 = 0;
        this = allServersThreads.
               super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
               super__Vector_impl_data._M_start, iVar10 != 10000; iVar10 = iVar10 + 1) {
      bVar1 = true;
      for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 4) {
        bVar1 = (bool)(bVar1 & *(int *)((long)robotStatus + lVar2) == 0);
      }
      if (bVar1) break;
      cycle(2);
      sched_yield();
    }
    for (; this != allServersThreads.
                   super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish; this = this + 1) {
      std::future<void>::get(this);
    }
    LOCK();
    stopAll.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
    UNLOCK();
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector(&allServersThreads)
    ;
    cppforth::Forth::~Forth(&forth2);
    cppforth::Forth::~Forth(&forth1);
    local_10cc = local_10cc + 1;
  } while( true );
LAB_0010edf2:
  move_robots(0);
  move_miss(0);
  local_1120 = lVar2 + 0xf;
  pamVar9 = missiles;
  for (lVar7 = 0; lVar2 = local_1120, lVar7 != 2; lVar7 = lVar7 + 1) {
    lVar2 = 0;
    pmVar11 = *pamVar9;
    for (; lVar2 != 2; lVar2 = lVar2 + 1) {
      if (((missile *)&pmVar11->stat)->stat == 2) {
        count_miss((int)lVar7,(int)lVar2);
      }
      pmVar11 = pmVar11 + 1;
    }
    pamVar9 = (missile (*) [2])((long)pamVar9 + 0x58);
  }
  goto LAB_0010ed9f;
}

Assistant:

int match1vs1(int matches,
	long limit,
	const std::string &command1,
	const std::string &command2	)
{
	int num_robots = 2;
	stopAll.store(0);
	int robotsleft;
	int m_count;
	int movement;
	int i, j, k;
	int wins[MAXROBOTS];
	int ties[MAXROBOTS];
	long counter{};

	r_debug = 0;  /* turns off full compile info */

	for (i = 0; i < num_robots; i++) {
		wins[i] = 0;
		ties[i] = 0;
	}

	for (m_count = 1; m_count <= matches; m_count++) {
		cppforth::Forth forth1{};
		InitForthRobot(forth1);
		InsertForthToInt(&forth1, 0);
		cppforth::Forth forth2{};
		InitForthRobot(forth2);
		InsertForthToInt(&forth2, 1);

		std::vector<std::future<void>> allServersThreads;
		allServersThreads.push_back(
			std::async([&forth1, &command1]{
			try{
				robotStatus[0] = StatusRun;
				forth1.ExecuteString(command1);
				robotStatus[0] = StatusException;
			}
			catch (...){
				robotStatus[0] = StatusException;
			}
		})
			);
		allServersThreads.push_back(
			std::async([&forth2, &command2]{
			try{
				robotStatus[1] = StatusRun;
				forth2.ExecuteString(command2);
				robotStatus[1] = StatusException;
			}
			catch (...){
				robotStatus[1] = StatusException;
			}
		})
			);

		for (i = 0; i < num_robots; i++) {
			init_robot(i);
			// robot_go should be here
			robots[i].status = ACTIVE;
		}
		rand_pos(num_robots);
		movement = MOTION_CYCLES;
		robotsleft = num_robots;
		counter = 0L;
		while (robotsleft > 1 && counter < limit) {
			robotsleft = 0;
			for (i = 0; i < num_robots; i++) {
				if (robots[i].status == ACTIVE) {
					robotsleft++;
					cur_robot = &robots[i];
				}
			}
			cycle(num_robots);

			if (--movement == 0) {
				counter += MOTION_CYCLES;
				movement = MOTION_CYCLES;
				move_robots(0);
				move_miss(0);
				for (i = 0; i < num_robots; i++) {
					for (j = 0; j < MIS_ROBOT; j++) {
						if (missiles[i][j].stat == EXPLODING) {
							count_miss(i, j);
						}
					}
				}
			}
		}

		/* allow any flying missiles to explode */
		while (1) {
			k = 0;
			for (i = 0; i < num_robots; i++) {
				for (j = 0; j < MIS_ROBOT; j++) {
					if (missiles[i][j].stat == FLYING) {
						k = 1;
					}
				}
			}
			if (k) {
				move_robots(0);
				move_miss(0);
			}
			else
				break;
		}

		k = 0;
		for (i = 0; i < num_robots; i++) {
			if (robots[i].status == ACTIVE) {
				k++;
			}
		}

		for (i = 0; i < num_robots; i++) {
			if (robots[i].status == ACTIVE) {
				if (k == 1)
					wins[i]++;
				else
					ties[i]++;
			}
		}
		stopAll.store(1);
		for (int i = 0; i < 10000; ++i){
			auto end = true;
			for (j = 0; j < 2; ++j){
				if (robotStatus[j] != StatusException){
					end = false;
				}
			}
			if (end)
				break;
			cycle(num_robots);
			std::this_thread::yield();
		}
		for (auto it = begin(allServersThreads); it != end(allServersThreads); ++it){
			try{
				(*it).get();
			}
			catch (std::exception &){
				;
			}
		}
		stopAll.store(0);
	}
	int result{};
	if (wins[0] > wins[1]) result = 1;
	else if(wins[0] < wins[1]) result = -1;
	return result; 

}